

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

aiReturn aiGetMaterialProperty
                   (aiMaterial *pMat,char *pKey,uint type,uint index,aiMaterialProperty **pPropOut)

{
  uint uVar1;
  int iVar2;
  aiReturn aVar3;
  uint i;
  ulong uVar4;
  aiMaterialProperty *paVar5;
  char *__assertion;
  
  if (pMat == (aiMaterial *)0x0) {
    __assertion = "pMat != __null";
    uVar1 = 0x42;
  }
  else if (pKey == (char *)0x0) {
    __assertion = "pKey != __null";
    uVar1 = 0x43;
  }
  else {
    if (pPropOut != (aiMaterialProperty **)0x0) {
      uVar1 = pMat->mNumProperties;
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        paVar5 = pMat->mProperties[uVar4];
        if (paVar5 != (aiMaterialProperty *)0x0) {
          iVar2 = strcmp((paVar5->mKey).data,pKey);
          if ((iVar2 == 0) && ((type == 0xffffffff || (paVar5->mSemantic == type)))) {
            aVar3 = aiReturn_SUCCESS;
            if ((index == 0xffffffff) || (paVar5->mIndex == index)) goto LAB_003b3d5f;
          }
        }
      }
      paVar5 = (aiMaterialProperty *)0x0;
      aVar3 = aiReturn_FAILURE;
LAB_003b3d5f:
      *pPropOut = paVar5;
      return aVar3;
    }
    __assertion = "pPropOut != __null";
    uVar1 = 0x44;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Material/MaterialSystem.cpp"
                ,uVar1,
                "aiReturn aiGetMaterialProperty(const aiMaterial *, const char *, unsigned int, unsigned int, const aiMaterialProperty **)"
               );
}

Assistant:

aiReturn aiGetMaterialProperty(const aiMaterial* pMat,
    const char* pKey,
    unsigned int type,
    unsigned int index,
    const aiMaterialProperty** pPropOut)
{
    ai_assert( pMat != NULL );
    ai_assert( pKey != NULL );
    ai_assert( pPropOut != NULL );

    /*  Just search for a property with exactly this name ..
     *  could be improved by hashing, but it's possibly
     *  no worth the effort (we're bound to C structures,
     *  thus std::map or derivates are not applicable. */
    for ( unsigned int i = 0; i < pMat->mNumProperties; ++i ) {
        aiMaterialProperty* prop = pMat->mProperties[i];

        if (prop /* just for safety ... */
            && 0 == strcmp( prop->mKey.data, pKey )
            && (UINT_MAX == type  || prop->mSemantic == type) /* UINT_MAX is a wild-card, but this is undocumented :-) */
            && (UINT_MAX == index || prop->mIndex == index))
        {
            *pPropOut = pMat->mProperties[i];
            return AI_SUCCESS;
        }
    }
    *pPropOut = NULL;
    return AI_FAILURE;
}